

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_hostcheck.c
# Opt level: O3

int amqp_raw_nequal(char *first,char *second,size_t max)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  
  cVar1 = *first;
  if (cVar1 != '\0') {
    pcVar4 = first + 1;
    do {
      cVar2 = *second;
      if ((cVar2 == '\0') || (max == 0)) goto LAB_0010d0de;
      cVar1 = amqp_raw_toupper(cVar1);
      cVar2 = amqp_raw_toupper(cVar2);
      if (cVar1 != cVar2) goto LAB_0010d0f7;
      max = max - 1;
      second = second + 1;
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 != '\0');
  }
  cVar1 = '\0';
LAB_0010d0de:
  if (max == 0) {
    uVar3 = 1;
  }
  else {
    cVar2 = *second;
    cVar1 = amqp_raw_toupper(cVar1);
    cVar2 = amqp_raw_toupper(cVar2);
LAB_0010d0f7:
    uVar3 = (uint)(cVar1 == cVar2);
  }
  return uVar3;
}

Assistant:

static int
amqp_raw_nequal(const char *first, const char *second, size_t max)
{
  while (*first && *second && max) {
    if (amqp_raw_toupper(*first) != amqp_raw_toupper(*second)) {
      break;
    }
    max--;
    first++;
    second++;
  }
  if (0 == max) {
    return 1; /* they are equal this far */
  }
  return amqp_raw_toupper(*first) == amqp_raw_toupper(*second);
}